

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsmJsModule.cpp
# Opt level: O0

bool __thiscall Js::AsmJsModuleCompiler::Init(AsmJsModuleCompiler *this)

{
  PropertyId PVar1;
  undefined8 uVar2;
  bool bVar3;
  AsmJSMathBuiltinFunction mathLibFunctionName;
  AsmJSTypedArrayBuiltinFunction arrayLibFunctionName;
  ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *pAVar4;
  AsmJsMathFunction *pAVar5;
  AsmJsTypedArrayFunction *pAVar6;
  AsmJsTypedArrayFunction **local_1068;
  AsmJsMathFunction **local_db0;
  int local_d9c;
  int i_2;
  TrackAllocData local_d88;
  AsmJsTypedArrayFunction *local_d60;
  ArrayFunc local_d58;
  undefined8 local_d48;
  TrackAllocData local_d40;
  AsmJsTypedArrayFunction *local_d18;
  ArrayFunc AStack_d10;
  undefined8 local_d00;
  TrackAllocData local_cf8;
  AsmJsTypedArrayFunction *local_cd0;
  ArrayFunc AStack_cc8;
  undefined8 local_cb8;
  TrackAllocData local_cb0;
  AsmJsTypedArrayFunction *local_c88;
  ArrayFunc AStack_c80;
  undefined8 local_c70;
  TrackAllocData local_c68;
  AsmJsTypedArrayFunction *local_c40;
  ArrayFunc AStack_c38;
  undefined8 local_c28;
  TrackAllocData local_c20;
  AsmJsTypedArrayFunction *local_bf8;
  ArrayFunc AStack_bf0;
  undefined8 local_be0;
  TrackAllocData local_bd8;
  AsmJsTypedArrayFunction *local_bb0;
  ArrayFunc AStack_ba8;
  undefined8 local_b98;
  TrackAllocData local_b90;
  AsmJsTypedArrayFunction *local_b68;
  ArrayFunc AStack_b60;
  ArrayFunc arrayFunctions [19];
  int local_a20;
  int i_1;
  int size;
  ConstMath constMath [10];
  int i;
  TrackAllocData local_960;
  AsmJsRetType local_934;
  code *local_930;
  undefined8 local_928;
  TrackAllocData local_920;
  AsmJsRetType local_8f4;
  code *local_8f0;
  undefined8 local_8e8;
  TrackAllocData local_8e0;
  AsmJsRetType local_8b4;
  code *local_8b0;
  undefined8 local_8a8;
  TrackAllocData local_8a0;
  AsmJsRetType local_874;
  code *local_870;
  undefined8 local_868;
  TrackAllocData local_860;
  AsmJsRetType local_834;
  code *local_830;
  undefined8 local_828;
  TrackAllocData local_820;
  AsmJsRetType local_7f4;
  code *local_7f0;
  undefined8 local_7e8;
  TrackAllocData local_7e0;
  AsmJsRetType local_7b4;
  code *local_7b0;
  undefined8 local_7a8;
  TrackAllocData local_7a0;
  AsmJsRetType local_774;
  code *local_770;
  undefined8 local_768;
  TrackAllocData local_760;
  AsmJsRetType local_734;
  code *local_730;
  undefined8 local_728;
  TrackAllocData local_720;
  AsmJsMathFunction *local_6f8;
  undefined1 auStack_6f0 [12];
  AsmJsRetType local_6e4;
  code *local_6e0;
  undefined8 local_6d8;
  TrackAllocData local_6d0;
  AsmJsMathFunction *local_6a8;
  undefined1 auStack_6a0 [12];
  AsmJsRetType local_694;
  code *local_690;
  undefined8 local_688;
  TrackAllocData local_680;
  AsmJsMathFunction *local_658;
  undefined1 auStack_650 [12];
  AsmJsRetType local_644;
  code *local_640;
  undefined8 local_638;
  TrackAllocData local_630;
  AsmJsMathFunction *local_608;
  undefined1 auStack_600 [12];
  AsmJsRetType local_5f4;
  code *local_5f0;
  undefined8 local_5e8;
  TrackAllocData local_5e0;
  AsmJsMathFunction *local_5b8;
  undefined1 auStack_5b0 [12];
  AsmJsRetType local_5a4;
  code *local_5a0;
  undefined8 local_598;
  TrackAllocData local_590;
  AsmJsMathFunction *local_568;
  undefined1 auStack_560 [12];
  AsmJsRetType local_554;
  code *local_550;
  undefined8 local_548;
  TrackAllocData local_540;
  AsmJsMathFunction *local_518;
  undefined1 auStack_510 [12];
  AsmJsRetType local_504;
  code *local_500;
  undefined8 local_4f8;
  TrackAllocData local_4f0;
  AsmJsMathFunction *local_4c8;
  undefined1 auStack_4c0 [12];
  AsmJsRetType local_4b4;
  code *local_4b0;
  undefined8 local_4a8;
  TrackAllocData local_4a0;
  AsmJsMathFunction *local_478;
  undefined1 auStack_470 [12];
  AsmJsRetType local_464;
  code *local_460;
  undefined8 local_458;
  TrackAllocData local_450;
  AsmJsMathFunction *local_428;
  undefined1 auStack_420 [12];
  AsmJsRetType local_414;
  code *local_410;
  undefined8 local_408;
  TrackAllocData local_400;
  AsmJsMathFunction *local_3d8;
  undefined1 auStack_3d0 [12];
  AsmJsRetType local_3c4;
  code *local_3c0;
  undefined8 local_3b8;
  TrackAllocData local_3b0;
  AsmJsMathFunction *local_388;
  undefined1 auStack_380 [12];
  AsmJsRetType local_374;
  code *local_370;
  undefined8 local_368;
  TrackAllocData local_360;
  AsmJsMathFunction *local_338;
  undefined1 auStack_330 [12];
  AsmJsRetType local_324;
  code *local_320;
  undefined8 local_318;
  TrackAllocData local_310;
  AsmJsMathFunction *local_2e8;
  undefined1 auStack_2e0 [12];
  AsmJsRetType local_2d4;
  code *local_2d0;
  undefined8 local_2c8;
  TrackAllocData local_2c0;
  AsmJsMathFunction *local_298;
  undefined1 auStack_290 [12];
  AsmJsRetType local_284;
  code *local_280;
  undefined8 local_278;
  TrackAllocData local_270;
  AsmJsMathFunction *local_248;
  undefined1 auStack_240 [12];
  AsmJsRetType local_234;
  code *local_230;
  undefined8 local_228;
  TrackAllocData local_220;
  AsmJsMathFunction *local_1f8;
  undefined1 auStack_1f0 [12];
  AsmJsRetType local_1e4;
  code *local_1e0;
  undefined8 local_1d8;
  TrackAllocData local_1d0;
  AsmJsMathFunction *local_1a8;
  undefined1 auStack_1a0 [12];
  AsmJsRetType local_194;
  code *local_190;
  undefined8 local_188;
  TrackAllocData local_180;
  AsmJsMathFunction *local_158;
  MathFunc MStack_150;
  MathFunc mathFunctions [19];
  AsmJsModuleCompiler *this_local;
  
  if (((byte)this->field_0x2e4 >> 3 & 1) == 0) {
    this->field_0x2e4 = this->field_0x2e4 & 0xf7 | 8;
    local_db0 = &MStack_150.val;
    mathFunctions[0x12].val = (AsmJsMathFunction *)this;
    do {
      Init()::MathFunc::MathFunc(int,Js::AsmJsMathFunction__(local_db0,0,(AsmJsMathFunction *)0x0);
      local_db0 = local_db0 + 2;
    } while (local_db0 != &mathFunctions[0x12].val);
    Memory::TrackAllocData::CreateTrackAllocData
              (&local_180,(type_info *)&AsmJsMathFunction::typeinfo,0,0xffffffffffffffff,
               "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/AsmJsModule.cpp"
               ,0x448);
    pAVar4 = Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
             TrackAllocInfo((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *)
                            this,&local_180);
    local_190 = Memory::ArenaAllocator::Alloc;
    local_188 = 0;
    pAVar5 = (AsmJsMathFunction *)
             new<Memory::ArenaAllocator>(0x50,(ArenaAllocator *)pAVar4,0x3f67b0);
    AsmJsRetType::AsmJsRetType(&local_194,Double);
    AsmJsMathFunction::AsmJsMathFunction
              (pAVar5,(PropertyName)0x0,&this->mAllocator,1,AsmJSMathBuiltin_sin,Sin_Db,local_194,4)
    ;
    Init()::MathFunc::MathFunc(int,Js::AsmJsMathFunction__(&local_158,0x2f,pAVar5);
    MStack_150.val = local_158;
    mathFunctions[0].id = MStack_150.id;
    mathFunctions[0]._4_4_ = MStack_150._4_4_;
    Memory::TrackAllocData::CreateTrackAllocData
              (&local_1d0,(type_info *)&AsmJsMathFunction::typeinfo,0,0xffffffffffffffff,
               "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/AsmJsModule.cpp"
               ,0x449);
    pAVar4 = Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
             TrackAllocInfo((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *)
                            this,&local_1d0);
    local_1e0 = Memory::ArenaAllocator::Alloc;
    local_1d8 = 0;
    pAVar5 = (AsmJsMathFunction *)
             new<Memory::ArenaAllocator>(0x50,(ArenaAllocator *)pAVar4,0x3f67b0);
    AsmJsRetType::AsmJsRetType(&local_1e4,Double);
    AsmJsMathFunction::AsmJsMathFunction
              (pAVar5,(PropertyName)0x0,&this->mAllocator,1,AsmJSMathBuiltin_cos,Cos_Db,local_1e4,4)
    ;
    Init()::MathFunc::MathFunc(int,Js::AsmJsMathFunction__(&local_1a8,0x24,pAVar5);
    mathFunctions[0].val = local_1a8;
    mathFunctions[1]._0_8_ = auStack_1a0._0_8_;
    Memory::TrackAllocData::CreateTrackAllocData
              (&local_220,(type_info *)&AsmJsMathFunction::typeinfo,0,0xffffffffffffffff,
               "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/AsmJsModule.cpp"
               ,0x44a);
    pAVar4 = Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
             TrackAllocInfo((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *)
                            this,&local_220);
    local_230 = Memory::ArenaAllocator::Alloc;
    local_228 = 0;
    pAVar5 = (AsmJsMathFunction *)
             new<Memory::ArenaAllocator>(0x50,(ArenaAllocator *)pAVar4,0x3f67b0);
    AsmJsRetType::AsmJsRetType(&local_234,Double);
    AsmJsMathFunction::AsmJsMathFunction
              (pAVar5,(PropertyName)0x0,&this->mAllocator,1,AsmJSMathBuiltin_tan,Tan_Db,local_234,4)
    ;
    Init()::MathFunc::MathFunc(int,Js::AsmJsMathFunction__(&local_1f8,0x31,pAVar5);
    mathFunctions[1].val = local_1f8;
    mathFunctions[2]._0_8_ = auStack_1f0._0_8_;
    Memory::TrackAllocData::CreateTrackAllocData
              (&local_270,(type_info *)&AsmJsMathFunction::typeinfo,0,0xffffffffffffffff,
               "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/AsmJsModule.cpp"
               ,1099);
    pAVar4 = Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
             TrackAllocInfo((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *)
                            this,&local_270);
    local_280 = Memory::ArenaAllocator::Alloc;
    local_278 = 0;
    pAVar5 = (AsmJsMathFunction *)
             new<Memory::ArenaAllocator>(0x50,(ArenaAllocator *)pAVar4,0x3f67b0);
    AsmJsRetType::AsmJsRetType(&local_284,Double);
    AsmJsMathFunction::AsmJsMathFunction
              (pAVar5,(PropertyName)0x0,&this->mAllocator,1,AsmJSMathBuiltin_asin,Asin_Db,local_284,
               4);
    Init()::MathFunc::MathFunc(int,Js::AsmJsMathFunction__(&local_248,0x20,pAVar5);
    mathFunctions[2].val = local_248;
    mathFunctions[3]._0_8_ = auStack_240._0_8_;
    Memory::TrackAllocData::CreateTrackAllocData
              (&local_2c0,(type_info *)&AsmJsMathFunction::typeinfo,0,0xffffffffffffffff,
               "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/AsmJsModule.cpp"
               ,0x44c);
    pAVar4 = Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
             TrackAllocInfo((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *)
                            this,&local_2c0);
    local_2d0 = Memory::ArenaAllocator::Alloc;
    local_2c8 = 0;
    pAVar5 = (AsmJsMathFunction *)
             new<Memory::ArenaAllocator>(0x50,(ArenaAllocator *)pAVar4,0x3f67b0);
    AsmJsRetType::AsmJsRetType(&local_2d4,Double);
    AsmJsMathFunction::AsmJsMathFunction
              (pAVar5,(PropertyName)0x0,&this->mAllocator,1,AsmJSMathBuiltin_acos,Acos_Db,local_2d4,
               4);
    Init()::MathFunc::MathFunc(int,Js::AsmJsMathFunction__(&local_298,0x1e,pAVar5);
    mathFunctions[3].val = local_298;
    mathFunctions[4]._0_8_ = auStack_290._0_8_;
    Memory::TrackAllocData::CreateTrackAllocData
              (&local_310,(type_info *)&AsmJsMathFunction::typeinfo,0,0xffffffffffffffff,
               "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/AsmJsModule.cpp"
               ,0x44d);
    pAVar4 = Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
             TrackAllocInfo((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *)
                            this,&local_310);
    local_320 = Memory::ArenaAllocator::Alloc;
    local_318 = 0;
    pAVar5 = (AsmJsMathFunction *)
             new<Memory::ArenaAllocator>(0x50,(ArenaAllocator *)pAVar4,0x3f67b0);
    AsmJsRetType::AsmJsRetType(&local_324,Double);
    AsmJsMathFunction::AsmJsMathFunction
              (pAVar5,(PropertyName)0x0,&this->mAllocator,1,AsmJSMathBuiltin_atan,Atan_Db,local_324,
               4);
    Init()::MathFunc::MathFunc(int,Js::AsmJsMathFunction__(&local_2e8,0x21,pAVar5);
    mathFunctions[4].val = local_2e8;
    mathFunctions[5]._0_8_ = auStack_2e0._0_8_;
    Memory::TrackAllocData::CreateTrackAllocData
              (&local_360,(type_info *)&AsmJsMathFunction::typeinfo,0,0xffffffffffffffff,
               "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/AsmJsModule.cpp"
               ,0x44e);
    pAVar4 = Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
             TrackAllocInfo((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *)
                            this,&local_360);
    local_370 = Memory::ArenaAllocator::Alloc;
    local_368 = 0;
    pAVar5 = (AsmJsMathFunction *)
             new<Memory::ArenaAllocator>(0x50,(ArenaAllocator *)pAVar4,0x3f67b0);
    AsmJsRetType::AsmJsRetType(&local_374,Double);
    AsmJsMathFunction::AsmJsMathFunction
              (pAVar5,(PropertyName)0x0,&this->mAllocator,1,AsmJSMathBuiltin_ceil,Ceil_Db,local_374,
               4);
    Init()::MathFunc::MathFunc(int,Js::AsmJsMathFunction__(&local_338,0x23,pAVar5);
    mathFunctions[5].val = local_338;
    mathFunctions[6]._0_8_ = auStack_330._0_8_;
    Memory::TrackAllocData::CreateTrackAllocData
              (&local_3b0,(type_info *)&AsmJsMathFunction::typeinfo,0,0xffffffffffffffff,
               "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/AsmJsModule.cpp"
               ,0x44f);
    pAVar4 = Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
             TrackAllocInfo((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *)
                            this,&local_3b0);
    local_3c0 = Memory::ArenaAllocator::Alloc;
    local_3b8 = 0;
    pAVar5 = (AsmJsMathFunction *)
             new<Memory::ArenaAllocator>(0x50,(ArenaAllocator *)pAVar4,0x3f67b0);
    AsmJsRetType::AsmJsRetType(&local_3c4,Double);
    AsmJsMathFunction::AsmJsMathFunction
              (pAVar5,(PropertyName)0x0,&this->mAllocator,1,AsmJSMathBuiltin_floor,Floor_Db,
               local_3c4,4);
    Init()::MathFunc::MathFunc(int,Js::AsmJsMathFunction__(&local_388,0x26,pAVar5);
    mathFunctions[6].val = local_388;
    mathFunctions[7]._0_8_ = auStack_380._0_8_;
    Memory::TrackAllocData::CreateTrackAllocData
              (&local_400,(type_info *)&AsmJsMathFunction::typeinfo,0,0xffffffffffffffff,
               "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/AsmJsModule.cpp"
               ,0x450);
    pAVar4 = Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
             TrackAllocInfo((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *)
                            this,&local_400);
    local_410 = Memory::ArenaAllocator::Alloc;
    local_408 = 0;
    pAVar5 = (AsmJsMathFunction *)
             new<Memory::ArenaAllocator>(0x50,(ArenaAllocator *)pAVar4,0x3f67b0);
    AsmJsRetType::AsmJsRetType(&local_414,Double);
    AsmJsMathFunction::AsmJsMathFunction
              (pAVar5,(PropertyName)0x0,&this->mAllocator,1,AsmJSMathBuiltin_exp,Exp_Db,local_414,4)
    ;
    Init()::MathFunc::MathFunc(int,Js::AsmJsMathFunction__(&local_3d8,0x25,pAVar5);
    mathFunctions[7].val = local_3d8;
    mathFunctions[8]._0_8_ = auStack_3d0._0_8_;
    Memory::TrackAllocData::CreateTrackAllocData
              (&local_450,(type_info *)&AsmJsMathFunction::typeinfo,0,0xffffffffffffffff,
               "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/AsmJsModule.cpp"
               ,0x451);
    pAVar4 = Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
             TrackAllocInfo((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *)
                            this,&local_450);
    local_460 = Memory::ArenaAllocator::Alloc;
    local_458 = 0;
    pAVar5 = (AsmJsMathFunction *)
             new<Memory::ArenaAllocator>(0x50,(ArenaAllocator *)pAVar4,0x3f67b0);
    AsmJsRetType::AsmJsRetType(&local_464,Double);
    AsmJsMathFunction::AsmJsMathFunction
              (pAVar5,(PropertyName)0x0,&this->mAllocator,1,AsmJSMathBuiltin_log,Log_Db,local_464,4)
    ;
    Init()::MathFunc::MathFunc(int,Js::AsmJsMathFunction__(&local_428,0x27,pAVar5);
    mathFunctions[8].val = local_428;
    mathFunctions[9]._0_8_ = auStack_420._0_8_;
    Memory::TrackAllocData::CreateTrackAllocData
              (&local_4a0,(type_info *)&AsmJsMathFunction::typeinfo,0,0xffffffffffffffff,
               "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/AsmJsModule.cpp"
               ,0x452);
    pAVar4 = Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
             TrackAllocInfo((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *)
                            this,&local_4a0);
    local_4b0 = Memory::ArenaAllocator::Alloc;
    local_4a8 = 0;
    pAVar5 = (AsmJsMathFunction *)
             new<Memory::ArenaAllocator>(0x50,(ArenaAllocator *)pAVar4,0x3f67b0);
    AsmJsRetType::AsmJsRetType(&local_4b4,Double);
    AsmJsMathFunction::AsmJsMathFunction
              (pAVar5,(PropertyName)0x0,&this->mAllocator,2,AsmJSMathBuiltin_pow,Pow_Db,local_4b4,4,
               4);
    Init()::MathFunc::MathFunc(int,Js::AsmJsMathFunction__(&local_478,0x2c,pAVar5);
    mathFunctions[9].val = local_478;
    mathFunctions[10]._0_8_ = auStack_470._0_8_;
    Memory::TrackAllocData::CreateTrackAllocData
              (&local_4f0,(type_info *)&AsmJsMathFunction::typeinfo,0,0xffffffffffffffff,
               "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/AsmJsModule.cpp"
               ,0x453);
    pAVar4 = Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
             TrackAllocInfo((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *)
                            this,&local_4f0);
    local_500 = Memory::ArenaAllocator::Alloc;
    local_4f8 = 0;
    pAVar5 = (AsmJsMathFunction *)
             new<Memory::ArenaAllocator>(0x50,(ArenaAllocator *)pAVar4,0x3f67b0);
    AsmJsRetType::AsmJsRetType(&local_504,Double);
    AsmJsMathFunction::AsmJsMathFunction
              (pAVar5,(PropertyName)0x0,&this->mAllocator,1,AsmJSMathBuiltin_sqrt,Sqrt_Db,local_504,
               4);
    Init()::MathFunc::MathFunc(int,Js::AsmJsMathFunction__(&local_4c8,0x30,pAVar5);
    mathFunctions[10].val = local_4c8;
    mathFunctions[0xb]._0_8_ = auStack_4c0._0_8_;
    Memory::TrackAllocData::CreateTrackAllocData
              (&local_540,(type_info *)&AsmJsMathFunction::typeinfo,0,0xffffffffffffffff,
               "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/AsmJsModule.cpp"
               ,0x454);
    pAVar4 = Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
             TrackAllocInfo((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *)
                            this,&local_540);
    local_550 = Memory::ArenaAllocator::Alloc;
    local_548 = 0;
    pAVar5 = (AsmJsMathFunction *)
             new<Memory::ArenaAllocator>(0x50,(ArenaAllocator *)pAVar4,0x3f67b0);
    AsmJsRetType::AsmJsRetType(&local_554,Double);
    AsmJsMathFunction::AsmJsMathFunction
              (pAVar5,(PropertyName)0x0,&this->mAllocator,1,AsmJSMathBuiltin_abs,Abs_Db,local_554,4)
    ;
    Init()::MathFunc::MathFunc(int,Js::AsmJsMathFunction__(&local_518,0x1d,pAVar5);
    mathFunctions[0xb].val = local_518;
    mathFunctions[0xc]._0_8_ = auStack_510._0_8_;
    Memory::TrackAllocData::CreateTrackAllocData
              (&local_590,(type_info *)&AsmJsMathFunction::typeinfo,0,0xffffffffffffffff,
               "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/AsmJsModule.cpp"
               ,0x455);
    pAVar4 = Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
             TrackAllocInfo((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *)
                            this,&local_590);
    local_5a0 = Memory::ArenaAllocator::Alloc;
    local_598 = 0;
    pAVar5 = (AsmJsMathFunction *)
             new<Memory::ArenaAllocator>(0x50,(ArenaAllocator *)pAVar4,0x3f67b0);
    AsmJsRetType::AsmJsRetType(&local_5a4,Double);
    AsmJsMathFunction::AsmJsMathFunction
              (pAVar5,(PropertyName)0x0,&this->mAllocator,2,AsmJSMathBuiltin_atan2,Atan2_Db,
               local_5a4,4,4);
    Init()::MathFunc::MathFunc(int,Js::AsmJsMathFunction__(&local_568,0x22,pAVar5);
    mathFunctions[0xc].val = local_568;
    mathFunctions[0xd]._0_8_ = auStack_560._0_8_;
    Memory::TrackAllocData::CreateTrackAllocData
              (&local_5e0,(type_info *)&AsmJsMathFunction::typeinfo,0,0xffffffffffffffff,
               "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/AsmJsModule.cpp"
               ,0x456);
    pAVar4 = Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
             TrackAllocInfo((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *)
                            this,&local_5e0);
    local_5f0 = Memory::ArenaAllocator::Alloc;
    local_5e8 = 0;
    pAVar5 = (AsmJsMathFunction *)
             new<Memory::ArenaAllocator>(0x50,(ArenaAllocator *)pAVar4,0x3f67b0);
    AsmJsRetType::AsmJsRetType(&local_5f4,Signed);
    AsmJsMathFunction::AsmJsMathFunction
              (pAVar5,(PropertyName)0x0,&this->mAllocator,2,AsmJSMathBuiltin_imul,Imul_Int,local_5f4
               ,0xc,0xc);
    Init()::MathFunc::MathFunc(int,Js::AsmJsMathFunction__(&local_5b8,0x40,pAVar5);
    mathFunctions[0xd].val = local_5b8;
    mathFunctions[0xe]._0_8_ = auStack_5b0._0_8_;
    Memory::TrackAllocData::CreateTrackAllocData
              (&local_630,(type_info *)&AsmJsMathFunction::typeinfo,0,0xffffffffffffffff,
               "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/AsmJsModule.cpp"
               ,0x457);
    pAVar4 = Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
             TrackAllocInfo((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *)
                            this,&local_630);
    local_640 = Memory::ArenaAllocator::Alloc;
    local_638 = 0;
    pAVar5 = (AsmJsMathFunction *)
             new<Memory::ArenaAllocator>(0x50,(ArenaAllocator *)pAVar4,0x3f67b0);
    AsmJsRetType::AsmJsRetType(&local_644,Float);
    AsmJsMathFunction::AsmJsMathFunction
              (pAVar5,(PropertyName)0x0,&this->mAllocator,1,AsmJSMathBuiltin_fround,Fround_Flt,
               local_644,7);
    Init()::MathFunc::MathFunc(int,Js::AsmJsMathFunction__(&local_608,0x42,pAVar5);
    mathFunctions[0xe].val = local_608;
    mathFunctions[0xf]._0_8_ = auStack_600._0_8_;
    Memory::TrackAllocData::CreateTrackAllocData
              (&local_680,(type_info *)&AsmJsMathFunction::typeinfo,0,0xffffffffffffffff,
               "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/AsmJsModule.cpp"
               ,0x458);
    pAVar4 = Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
             TrackAllocInfo((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *)
                            this,&local_680);
    local_690 = Memory::ArenaAllocator::Alloc;
    local_688 = 0;
    pAVar5 = (AsmJsMathFunction *)
             new<Memory::ArenaAllocator>(0x50,(ArenaAllocator *)pAVar4,0x3f67b0);
    AsmJsRetType::AsmJsRetType(&local_694,Double);
    AsmJsMathFunction::AsmJsMathFunction
              (pAVar5,(PropertyName)0x0,&this->mAllocator,2,AsmJSMathBuiltin_min,Min_Db,local_694,4,
               4);
    Init()::MathFunc::MathFunc(int,Js::AsmJsMathFunction__(&local_658,0x2a,pAVar5);
    mathFunctions[0xf].val = local_658;
    mathFunctions[0x10]._0_8_ = auStack_650._0_8_;
    Memory::TrackAllocData::CreateTrackAllocData
              (&local_6d0,(type_info *)&AsmJsMathFunction::typeinfo,0,0xffffffffffffffff,
               "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/AsmJsModule.cpp"
               ,0x459);
    pAVar4 = Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
             TrackAllocInfo((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *)
                            this,&local_6d0);
    local_6e0 = Memory::ArenaAllocator::Alloc;
    local_6d8 = 0;
    pAVar5 = (AsmJsMathFunction *)
             new<Memory::ArenaAllocator>(0x50,(ArenaAllocator *)pAVar4,0x3f67b0);
    AsmJsRetType::AsmJsRetType(&local_6e4,Double);
    AsmJsMathFunction::AsmJsMathFunction
              (pAVar5,(PropertyName)0x0,&this->mAllocator,2,AsmJSMathBuiltin_max,Max_Db,local_6e4,4,
               4);
    Init()::MathFunc::MathFunc(int,Js::AsmJsMathFunction__(&local_6a8,0xfe,pAVar5);
    mathFunctions[0x10].val = local_6a8;
    mathFunctions[0x11]._0_8_ = auStack_6a0._0_8_;
    Memory::TrackAllocData::CreateTrackAllocData
              (&local_720,(type_info *)&AsmJsMathFunction::typeinfo,0,0xffffffffffffffff,
               "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/AsmJsModule.cpp"
               ,0x45a);
    pAVar4 = Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
             TrackAllocInfo((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *)
                            this,&local_720);
    local_730 = Memory::ArenaAllocator::Alloc;
    local_728 = 0;
    pAVar5 = (AsmJsMathFunction *)
             new<Memory::ArenaAllocator>(0x50,(ArenaAllocator *)pAVar4,0x3f67b0);
    AsmJsRetType::AsmJsRetType(&local_734,Fixnum);
    AsmJsMathFunction::AsmJsMathFunction
              (pAVar5,(PropertyName)0x0,&this->mAllocator,1,AsmJSMathBuiltin_clz32,Clz32_Int,
               local_734,0xc);
    Init()::MathFunc::MathFunc(int,Js::AsmJsMathFunction__(&local_6f8,0x41,pAVar5);
    uVar2 = mathFunctions[0xc]._0_8_;
    mathFunctions[0x11].val = local_6f8;
    mathFunctions[0x12]._0_8_ = auStack_6f0._0_8_;
    Memory::TrackAllocData::CreateTrackAllocData
              (&local_760,(type_info *)&AsmJsMathFunction::typeinfo,0,0xffffffffffffffff,
               "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/AsmJsModule.cpp"
               ,0x45c);
    pAVar4 = Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
             TrackAllocInfo((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *)
                            this,&local_760);
    local_770 = Memory::ArenaAllocator::Alloc;
    local_768 = 0;
    pAVar5 = (AsmJsMathFunction *)
             new<Memory::ArenaAllocator>(0x50,(ArenaAllocator *)pAVar4,0x3f67b0);
    AsmJsRetType::AsmJsRetType(&local_774,Unsigned);
    AsmJsMathFunction::AsmJsMathFunction
              (pAVar5,(PropertyName)0x0,&this->mAllocator,1,AsmJSMathBuiltin_abs,Abs_Int,local_774,
               10);
    AsmJsMathFunction::SetOverload((AsmJsMathFunction *)uVar2,pAVar5);
    uVar2 = mathFunctions[0x10]._0_8_;
    Memory::TrackAllocData::CreateTrackAllocData
              (&local_7a0,(type_info *)&AsmJsMathFunction::typeinfo,0,0xffffffffffffffff,
               "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/AsmJsModule.cpp"
               ,0x45d);
    pAVar4 = Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
             TrackAllocInfo((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *)
                            this,&local_7a0);
    local_7b0 = Memory::ArenaAllocator::Alloc;
    local_7a8 = 0;
    pAVar5 = (AsmJsMathFunction *)
             new<Memory::ArenaAllocator>(0x50,(ArenaAllocator *)pAVar4,0x3f67b0);
    AsmJsRetType::AsmJsRetType(&local_7b4,Signed);
    AsmJsMathFunction::AsmJsMathFunction
              (pAVar5,(PropertyName)0x0,&this->mAllocator,2,AsmJSMathBuiltin_min,Min_Int,local_7b4,
               10,10);
    AsmJsMathFunction::SetOverload((AsmJsMathFunction *)uVar2,pAVar5);
    uVar2 = mathFunctions[0x11]._0_8_;
    Memory::TrackAllocData::CreateTrackAllocData
              (&local_7e0,(type_info *)&AsmJsMathFunction::typeinfo,0,0xffffffffffffffff,
               "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/AsmJsModule.cpp"
               ,0x45e);
    pAVar4 = Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
             TrackAllocInfo((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *)
                            this,&local_7e0);
    local_7f0 = Memory::ArenaAllocator::Alloc;
    local_7e8 = 0;
    pAVar5 = (AsmJsMathFunction *)
             new<Memory::ArenaAllocator>(0x50,(ArenaAllocator *)pAVar4,0x3f67b0);
    AsmJsRetType::AsmJsRetType(&local_7f4,Signed);
    AsmJsMathFunction::AsmJsMathFunction
              (pAVar5,(PropertyName)0x0,&this->mAllocator,2,AsmJSMathBuiltin_max,Max_Int,local_7f4,
               10,10);
    AsmJsMathFunction::SetOverload((AsmJsMathFunction *)uVar2,pAVar5);
    uVar2 = mathFunctions[0xf]._0_8_;
    Memory::TrackAllocData::CreateTrackAllocData
              (&local_820,(type_info *)&AsmJsMathFunction::typeinfo,0,0xffffffffffffffff,
               "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/AsmJsModule.cpp"
               ,0x461);
    pAVar4 = Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
             TrackAllocInfo((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *)
                            this,&local_820);
    local_830 = Memory::ArenaAllocator::Alloc;
    local_828 = 0;
    pAVar5 = (AsmJsMathFunction *)
             new<Memory::ArenaAllocator>(0x50,(ArenaAllocator *)pAVar4,0x3f67b0);
    AsmJsRetType::AsmJsRetType(&local_834,Float);
    AsmJsMathFunction::AsmJsMathFunction
              (pAVar5,(PropertyName)0x0,&this->mAllocator,1,AsmJSMathBuiltin_fround,Fround_Db,
               local_834,4);
    AsmJsMathFunction::SetOverload((AsmJsMathFunction *)uVar2,pAVar5);
    uVar2 = mathFunctions[0xf]._0_8_;
    Memory::TrackAllocData::CreateTrackAllocData
              (&local_860,(type_info *)&AsmJsMathFunction::typeinfo,0,0xffffffffffffffff,
               "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/AsmJsModule.cpp"
               ,0x462);
    pAVar4 = Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
             TrackAllocInfo((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *)
                            this,&local_860);
    local_870 = Memory::ArenaAllocator::Alloc;
    local_868 = 0;
    pAVar5 = (AsmJsMathFunction *)
             new<Memory::ArenaAllocator>(0x50,(ArenaAllocator *)pAVar4,0x3f67b0);
    AsmJsRetType::AsmJsRetType(&local_874,Float);
    AsmJsMathFunction::AsmJsMathFunction
              (pAVar5,(PropertyName)0x0,&this->mAllocator,1,AsmJSMathBuiltin_fround,Fround_Int,
               local_874,0);
    AsmJsMathFunction::SetOverload((AsmJsMathFunction *)uVar2,pAVar5);
    uVar2 = mathFunctions[0xc]._0_8_;
    Memory::TrackAllocData::CreateTrackAllocData
              (&local_8a0,(type_info *)&AsmJsMathFunction::typeinfo,0,0xffffffffffffffff,
               "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/AsmJsModule.cpp"
               ,0x463);
    pAVar4 = Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
             TrackAllocInfo((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *)
                            this,&local_8a0);
    local_8b0 = Memory::ArenaAllocator::Alloc;
    local_8a8 = 0;
    pAVar5 = (AsmJsMathFunction *)
             new<Memory::ArenaAllocator>(0x50,(ArenaAllocator *)pAVar4,0x3f67b0);
    AsmJsRetType::AsmJsRetType(&local_8b4,Floatish);
    AsmJsMathFunction::AsmJsMathFunction
              (pAVar5,(PropertyName)0x0,&this->mAllocator,1,AsmJSMathBuiltin_abs,Abs_Flt,local_8b4,6
              );
    AsmJsMathFunction::SetOverload((AsmJsMathFunction *)uVar2,pAVar5);
    uVar2 = mathFunctions[6]._0_8_;
    Memory::TrackAllocData::CreateTrackAllocData
              (&local_8e0,(type_info *)&AsmJsMathFunction::typeinfo,0,0xffffffffffffffff,
               "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/AsmJsModule.cpp"
               ,0x464);
    pAVar4 = Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
             TrackAllocInfo((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *)
                            this,&local_8e0);
    local_8f0 = Memory::ArenaAllocator::Alloc;
    local_8e8 = 0;
    pAVar5 = (AsmJsMathFunction *)
             new<Memory::ArenaAllocator>(0x50,(ArenaAllocator *)pAVar4,0x3f67b0);
    AsmJsRetType::AsmJsRetType(&local_8f4,Floatish);
    AsmJsMathFunction::AsmJsMathFunction
              (pAVar5,(PropertyName)0x0,&this->mAllocator,1,AsmJSMathBuiltin_ceil,Ceil_Flt,local_8f4
               ,6);
    AsmJsMathFunction::SetOverload((AsmJsMathFunction *)uVar2,pAVar5);
    uVar2 = mathFunctions[7]._0_8_;
    Memory::TrackAllocData::CreateTrackAllocData
              (&local_920,(type_info *)&AsmJsMathFunction::typeinfo,0,0xffffffffffffffff,
               "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/AsmJsModule.cpp"
               ,0x465);
    pAVar4 = Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
             TrackAllocInfo((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *)
                            this,&local_920);
    local_930 = Memory::ArenaAllocator::Alloc;
    local_928 = 0;
    pAVar5 = (AsmJsMathFunction *)
             new<Memory::ArenaAllocator>(0x50,(ArenaAllocator *)pAVar4,0x3f67b0);
    AsmJsRetType::AsmJsRetType(&local_934,Floatish);
    AsmJsMathFunction::AsmJsMathFunction
              (pAVar5,(PropertyName)0x0,&this->mAllocator,1,AsmJSMathBuiltin_floor,Floor_Flt,
               local_934,6);
    AsmJsMathFunction::SetOverload((AsmJsMathFunction *)uVar2,pAVar5);
    uVar2 = mathFunctions[0xb]._0_8_;
    Memory::TrackAllocData::CreateTrackAllocData
              (&local_960,(type_info *)&AsmJsMathFunction::typeinfo,0,0xffffffffffffffff,
               "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/AsmJsModule.cpp"
               ,0x466);
    pAVar4 = Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
             TrackAllocInfo((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *)
                            this,&local_960);
    pAVar5 = (AsmJsMathFunction *)
             new<Memory::ArenaAllocator>(0x50,(ArenaAllocator *)pAVar4,0x3f67b0);
    AsmJsRetType::AsmJsRetType((AsmJsRetType *)((long)&constMath[9].val + 4),Floatish);
    AsmJsMathFunction::AsmJsMathFunction
              (pAVar5,(PropertyName)0x0,&this->mAllocator,1,AsmJSMathBuiltin_sqrt,Sqrt_Flt,
               constMath[9].val._4_4_,6);
    AsmJsMathFunction::SetOverload((AsmJsMathFunction *)uVar2,pAVar5);
    for (constMath[9].val._0_4_ = 0; (int)constMath[9].val < 0x13;
        constMath[9].val._0_4_ = (int)constMath[9].val + 1) {
      PVar1 = *(PropertyId *)&mathFunctions[(long)(int)constMath[9].val + -1].val;
      pAVar5 = *(AsmJsMathFunction **)(mathFunctions + (int)constMath[9].val);
      mathLibFunctionName =
           AsmJsMathFunction::GetMathBuiltInFunction
                     (*(AsmJsMathFunction **)(mathFunctions + (int)constMath[9].val));
      bVar3 = AddStandardLibraryMathName(this,PVar1,pAVar5,mathLibFunctionName);
      if (!bVar3) {
        return false;
      }
    }
    Init()::ConstMath::ConstMath(int,double_const*,Js::AsmJSMathBuiltinFunction_
              (&i_1,0x75,(double *)&Math::E,AsmJSMathBuiltin_e);
    Init()::ConstMath::ConstMath(int,double_const*,Js::AsmJSMathBuiltinFunction_
              (&constMath[0].val,0xd3,(double *)&Math::LN10,AsmJSMathBuiltin_ln10);
    Init()::ConstMath::ConstMath(int,double_const*,Js::AsmJSMathBuiltinFunction_
              (&constMath[1].val,0xd4,(double *)&Math::LN2,AsmJSMathBuiltin_ln2);
    Init()::ConstMath::ConstMath(int,double_const*,Js::AsmJSMathBuiltinFunction_
              (&constMath[2].val,0x29,(double *)&Math::LOG2E,AsmJSMathBuiltin_log2e);
    Init()::ConstMath::ConstMath(int,double_const*,Js::AsmJSMathBuiltinFunction_
              (&constMath[3].val,0x28,(double *)&Math::LOG10E,AsmJSMathBuiltin_log10e);
    Init()::ConstMath::ConstMath(int,double_const*,Js::AsmJSMathBuiltinFunction_
              (&constMath[4].val,0x2b,(double *)&Math::PI,AsmJSMathBuiltin_pi);
    Init()::ConstMath::ConstMath(int,double_const*,Js::AsmJSMathBuiltinFunction_
              (&constMath[5].val,0x157,(double *)&Math::SQRT1_2,AsmJSMathBuiltin_sqrt1_2);
    Init()::ConstMath::ConstMath(int,double_const*,Js::AsmJSMathBuiltinFunction_
              (&constMath[6].val,0x158,(double *)&Math::SQRT2,AsmJSMathBuiltin_sqrt2);
    Init()::ConstMath::ConstMath(int,double_const*,Js::AsmJSMathBuiltinFunction_
              (&constMath[7].val,0xba,&NumberConstants::POSITIVE_INFINITY,AsmJSMathBuiltin_infinity)
    ;
    Init()::ConstMath::ConstMath(int,double_const*,Js::AsmJSMathBuiltinFunction_
              (&constMath[8].val,0x105,&NumberConstants::NaN,AsmJSMathBuiltin_nan);
    for (local_a20 = 0; local_a20 < 10; local_a20 = local_a20 + 1) {
      bVar3 = AddStandardLibraryMathName
                        (this,(&i_1)[(long)local_a20 * 4],*(double **)(constMath + local_a20),
                         *(AsmJSMathBuiltinFunction *)
                          ((long)&constMath[(long)local_a20 + -1].val + 4));
      if (!bVar3) {
        return false;
      }
    }
    local_1068 = &AStack_b60.val;
    do {
      Init()::ArrayFunc::ArrayFunc(int,Js::AsmJsTypedArrayFunction__
                (local_1068,0,(AsmJsTypedArrayFunction *)0x0);
      local_1068 = local_1068 + 2;
    } while (local_1068 != &arrayFunctions[0x12].val);
    Memory::TrackAllocData::CreateTrackAllocData
              (&local_b90,(type_info *)&AsmJsTypedArrayFunction::typeinfo,0,0xffffffffffffffff,
               "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/AsmJsModule.cpp"
               ,0x499);
    pAVar4 = Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
             TrackAllocInfo((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *)
                            this,&local_b90);
    AStack_ba8.val = (AsmJsTypedArrayFunction *)Memory::ArenaAllocator::Alloc;
    local_b98 = 0;
    pAVar6 = (AsmJsTypedArrayFunction *)
             new<Memory::ArenaAllocator>(0x40,(ArenaAllocator *)pAVar4,0x3f67b0);
    AsmJsTypedArrayFunction::AsmJsTypedArrayFunction
              (pAVar6,(PropertyName)0x0,&this->mAllocator,AsmJSTypedArrayBuiltin_Int8Array,TYPE_INT8
              );
    Init()::ArrayFunc::ArrayFunc(int,Js::AsmJsTypedArrayFunction__(&local_b68,0x1ad,pAVar6);
    arrayFunctions[0].val = local_b68;
    arrayFunctions[1].id = AStack_b60.id;
    arrayFunctions[1]._4_4_ = AStack_b60._4_4_;
    Memory::TrackAllocData::CreateTrackAllocData
              (&local_bd8,(type_info *)&AsmJsTypedArrayFunction::typeinfo,0,0xffffffffffffffff,
               "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/AsmJsModule.cpp"
               ,0x49a);
    pAVar4 = Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
             TrackAllocInfo((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *)
                            this,&local_bd8);
    AStack_bf0.val = (AsmJsTypedArrayFunction *)Memory::ArenaAllocator::Alloc;
    local_be0 = 0;
    pAVar6 = (AsmJsTypedArrayFunction *)
             new<Memory::ArenaAllocator>(0x40,(ArenaAllocator *)pAVar4,0x3f67b0);
    AsmJsTypedArrayFunction::AsmJsTypedArrayFunction
              (pAVar6,(PropertyName)0x0,&this->mAllocator,AsmJSTypedArrayBuiltin_Uint8Array,
               TYPE_UINT8);
    Init()::ArrayFunc::ArrayFunc(int,Js::AsmJsTypedArrayFunction__(&local_bb0,0x1b0,pAVar6);
    AStack_b60.val = local_bb0;
    arrayFunctions[0].id = AStack_ba8.id;
    arrayFunctions[0]._4_4_ = AStack_ba8._4_4_;
    Memory::TrackAllocData::CreateTrackAllocData
              (&local_c20,(type_info *)&AsmJsTypedArrayFunction::typeinfo,0,0xffffffffffffffff,
               "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/AsmJsModule.cpp"
               ,0x49b);
    pAVar4 = Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
             TrackAllocInfo((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *)
                            this,&local_c20);
    AStack_c38.val = (AsmJsTypedArrayFunction *)Memory::ArenaAllocator::Alloc;
    local_c28 = 0;
    pAVar6 = (AsmJsTypedArrayFunction *)
             new<Memory::ArenaAllocator>(0x40,(ArenaAllocator *)pAVar4,0x3f67b0);
    AsmJsTypedArrayFunction::AsmJsTypedArrayFunction
              (pAVar6,(PropertyName)0x0,&this->mAllocator,AsmJSTypedArrayBuiltin_Int16Array,
               TYPE_INT16);
    Init()::ArrayFunc::ArrayFunc(int,Js::AsmJsTypedArrayFunction__(&local_bf8,0x1ae,pAVar6);
    arrayFunctions[2].val = local_bf8;
    arrayFunctions[3].id = AStack_bf0.id;
    arrayFunctions[3]._4_4_ = AStack_bf0._4_4_;
    Memory::TrackAllocData::CreateTrackAllocData
              (&local_c68,(type_info *)&AsmJsTypedArrayFunction::typeinfo,0,0xffffffffffffffff,
               "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/AsmJsModule.cpp"
               ,0x49c);
    pAVar4 = Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
             TrackAllocInfo((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *)
                            this,&local_c68);
    AStack_c80.val = (AsmJsTypedArrayFunction *)Memory::ArenaAllocator::Alloc;
    local_c70 = 0;
    pAVar6 = (AsmJsTypedArrayFunction *)
             new<Memory::ArenaAllocator>(0x40,(ArenaAllocator *)pAVar4,0x3f67b0);
    AsmJsTypedArrayFunction::AsmJsTypedArrayFunction
              (pAVar6,(PropertyName)0x0,&this->mAllocator,AsmJSTypedArrayBuiltin_Uint16Array,
               TYPE_UINT16);
    Init()::ArrayFunc::ArrayFunc(int,Js::AsmJsTypedArrayFunction__(&local_c40,0x1b2,pAVar6);
    arrayFunctions[1].val = local_c40;
    arrayFunctions[2].id = AStack_c38.id;
    arrayFunctions[2]._4_4_ = AStack_c38._4_4_;
    Memory::TrackAllocData::CreateTrackAllocData
              (&local_cb0,(type_info *)&AsmJsTypedArrayFunction::typeinfo,0,0xffffffffffffffff,
               "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/AsmJsModule.cpp"
               ,0x49d);
    pAVar4 = Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
             TrackAllocInfo((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *)
                            this,&local_cb0);
    AStack_cc8.val = (AsmJsTypedArrayFunction *)Memory::ArenaAllocator::Alloc;
    local_cb8 = 0;
    pAVar6 = (AsmJsTypedArrayFunction *)
             new<Memory::ArenaAllocator>(0x40,(ArenaAllocator *)pAVar4,0x3f67b0);
    AsmJsTypedArrayFunction::AsmJsTypedArrayFunction
              (pAVar6,(PropertyName)0x0,&this->mAllocator,AsmJSTypedArrayBuiltin_Int32Array,
               TYPE_INT32);
    Init()::ArrayFunc::ArrayFunc(int,Js::AsmJsTypedArrayFunction__(&local_c88,0x1af,pAVar6);
    arrayFunctions[4].val = local_c88;
    arrayFunctions[5].id = AStack_c80.id;
    arrayFunctions[5]._4_4_ = AStack_c80._4_4_;
    Memory::TrackAllocData::CreateTrackAllocData
              (&local_cf8,(type_info *)&AsmJsTypedArrayFunction::typeinfo,0,0xffffffffffffffff,
               "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/AsmJsModule.cpp"
               ,0x49e);
    pAVar4 = Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
             TrackAllocInfo((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *)
                            this,&local_cf8);
    AStack_d10.val = (AsmJsTypedArrayFunction *)Memory::ArenaAllocator::Alloc;
    local_d00 = 0;
    pAVar6 = (AsmJsTypedArrayFunction *)
             new<Memory::ArenaAllocator>(0x40,(ArenaAllocator *)pAVar4,0x3f67b0);
    AsmJsTypedArrayFunction::AsmJsTypedArrayFunction
              (pAVar6,(PropertyName)0x0,&this->mAllocator,AsmJSTypedArrayBuiltin_Uint32Array,
               TYPE_UINT32);
    Init()::ArrayFunc::ArrayFunc(int,Js::AsmJsTypedArrayFunction__(&local_cd0,0x1b3,pAVar6);
    arrayFunctions[3].val = local_cd0;
    arrayFunctions[4].id = AStack_cc8.id;
    arrayFunctions[4]._4_4_ = AStack_cc8._4_4_;
    Memory::TrackAllocData::CreateTrackAllocData
              (&local_d40,(type_info *)&AsmJsTypedArrayFunction::typeinfo,0,0xffffffffffffffff,
               "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/AsmJsModule.cpp"
               ,0x49f);
    pAVar4 = Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
             TrackAllocInfo((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *)
                            this,&local_d40);
    local_d58.val = (AsmJsTypedArrayFunction *)Memory::ArenaAllocator::Alloc;
    local_d48 = 0;
    pAVar6 = (AsmJsTypedArrayFunction *)
             new<Memory::ArenaAllocator>(0x40,(ArenaAllocator *)pAVar4,0x3f67b0);
    AsmJsTypedArrayFunction::AsmJsTypedArrayFunction
              (pAVar6,(PropertyName)0x0,&this->mAllocator,AsmJSTypedArrayBuiltin_Float32Array,
               TYPE_FLOAT32);
    Init()::ArrayFunc::ArrayFunc(int,Js::AsmJsTypedArrayFunction__(&local_d18,0x1b4,pAVar6);
    arrayFunctions[5].val = local_d18;
    arrayFunctions[6].id = AStack_d10.id;
    arrayFunctions[6]._4_4_ = AStack_d10._4_4_;
    Memory::TrackAllocData::CreateTrackAllocData
              (&local_d88,(type_info *)&AsmJsTypedArrayFunction::typeinfo,0,0xffffffffffffffff,
               "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/AsmJsModule.cpp"
               ,0x4a0);
    pAVar4 = Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
             TrackAllocInfo((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *)
                            this,&local_d88);
    pAVar6 = (AsmJsTypedArrayFunction *)
             new<Memory::ArenaAllocator>(0x40,(ArenaAllocator *)pAVar4,0x3f67b0);
    AsmJsTypedArrayFunction::AsmJsTypedArrayFunction
              (pAVar6,(PropertyName)0x0,&this->mAllocator,AsmJSTypedArrayBuiltin_Float64Array,
               TYPE_FLOAT64);
    Init()::ArrayFunc::ArrayFunc(int,Js::AsmJsTypedArrayFunction__(&local_d60,0x1b5,pAVar6);
    arrayFunctions[6].val = local_d60;
    arrayFunctions[7].id = local_d58.id;
    arrayFunctions[7]._4_4_ = local_d58._4_4_;
    for (local_d9c = 0; local_d9c < 8; local_d9c = local_d9c + 1) {
      PVar1 = *(PropertyId *)&arrayFunctions[(long)local_d9c + -1].val;
      pAVar6 = *(AsmJsTypedArrayFunction **)(arrayFunctions + local_d9c);
      arrayLibFunctionName =
           AsmJsTypedArrayFunction::GetArrayBuiltInFunction
                     (*(AsmJsTypedArrayFunction **)(arrayFunctions + local_d9c));
      bVar3 = AddStandardLibraryArrayName(this,PVar1,pAVar6,arrayLibFunctionName);
      if (!bVar3) {
        return false;
      }
    }
    this_local._7_1_ = true;
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool AsmJsModuleCompiler::Init()
    {
        if (mInitialised)
        {
            return false;
        }
        mInitialised = true;

        struct MathFunc
        {
            MathFunc(PropertyId id_ = 0, AsmJsMathFunction* val_ = nullptr) :
                id(id_), val(val_)
            {
            }
            PropertyId id;
            AsmJsMathFunction* val;
        };
        MathFunc mathFunctions[AsmJSMathBuiltinFunction_COUNT];
        // we could move the mathBuiltinFuncname to MathFunc struct
        mathFunctions[AsmJSMathBuiltin_sin] = MathFunc(PropertyIds::sin, Anew(&mAllocator, AsmJsMathFunction, nullptr, &mAllocator, 1, AsmJSMathBuiltin_sin, OpCodeAsmJs::Sin_Db, AsmJsRetType::Double, AsmJsType::MaybeDouble));
        mathFunctions[AsmJSMathBuiltin_cos] = MathFunc(PropertyIds::cos, Anew(&mAllocator, AsmJsMathFunction, nullptr, &mAllocator, 1, AsmJSMathBuiltin_cos, OpCodeAsmJs::Cos_Db, AsmJsRetType::Double, AsmJsType::MaybeDouble));
        mathFunctions[AsmJSMathBuiltin_tan] = MathFunc(PropertyIds::tan, Anew(&mAllocator, AsmJsMathFunction, nullptr, &mAllocator, 1, AsmJSMathBuiltin_tan, OpCodeAsmJs::Tan_Db, AsmJsRetType::Double, AsmJsType::MaybeDouble));
        mathFunctions[AsmJSMathBuiltin_asin] = MathFunc(PropertyIds::asin, Anew(&mAllocator, AsmJsMathFunction, nullptr, &mAllocator, 1, AsmJSMathBuiltin_asin, OpCodeAsmJs::Asin_Db, AsmJsRetType::Double, AsmJsType::MaybeDouble));
        mathFunctions[AsmJSMathBuiltin_acos] = MathFunc(PropertyIds::acos, Anew(&mAllocator, AsmJsMathFunction, nullptr, &mAllocator, 1, AsmJSMathBuiltin_acos, OpCodeAsmJs::Acos_Db, AsmJsRetType::Double, AsmJsType::MaybeDouble));
        mathFunctions[AsmJSMathBuiltin_atan] = MathFunc(PropertyIds::atan, Anew(&mAllocator, AsmJsMathFunction, nullptr, &mAllocator, 1, AsmJSMathBuiltin_atan, OpCodeAsmJs::Atan_Db, AsmJsRetType::Double, AsmJsType::MaybeDouble));
        mathFunctions[AsmJSMathBuiltin_ceil] = MathFunc(PropertyIds::ceil, Anew(&mAllocator, AsmJsMathFunction, nullptr, &mAllocator, 1, AsmJSMathBuiltin_ceil, OpCodeAsmJs::Ceil_Db, AsmJsRetType::Double, AsmJsType::MaybeDouble));
        mathFunctions[AsmJSMathBuiltin_floor] = MathFunc(PropertyIds::floor, Anew(&mAllocator, AsmJsMathFunction, nullptr, &mAllocator, 1, AsmJSMathBuiltin_floor, OpCodeAsmJs::Floor_Db, AsmJsRetType::Double, AsmJsType::MaybeDouble));
        mathFunctions[AsmJSMathBuiltin_exp] = MathFunc(PropertyIds::exp, Anew(&mAllocator, AsmJsMathFunction, nullptr, &mAllocator, 1, AsmJSMathBuiltin_exp, OpCodeAsmJs::Exp_Db, AsmJsRetType::Double, AsmJsType::MaybeDouble));
        mathFunctions[AsmJSMathBuiltin_log] = MathFunc(PropertyIds::log, Anew(&mAllocator, AsmJsMathFunction, nullptr, &mAllocator, 1, AsmJSMathBuiltin_log, OpCodeAsmJs::Log_Db, AsmJsRetType::Double, AsmJsType::MaybeDouble));
        mathFunctions[AsmJSMathBuiltin_pow] = MathFunc(PropertyIds::pow, Anew(&mAllocator, AsmJsMathFunction, nullptr, &mAllocator, 2, AsmJSMathBuiltin_pow, OpCodeAsmJs::Pow_Db, AsmJsRetType::Double, AsmJsType::MaybeDouble, AsmJsType::MaybeDouble));
        mathFunctions[AsmJSMathBuiltin_sqrt] = MathFunc(PropertyIds::sqrt, Anew(&mAllocator, AsmJsMathFunction, nullptr, &mAllocator, 1, AsmJSMathBuiltin_sqrt, OpCodeAsmJs::Sqrt_Db, AsmJsRetType::Double, AsmJsType::MaybeDouble));
        mathFunctions[AsmJSMathBuiltin_abs] = MathFunc(PropertyIds::abs, Anew(&mAllocator, AsmJsMathFunction, nullptr, &mAllocator, 1, AsmJSMathBuiltin_abs, OpCodeAsmJs::Abs_Db, AsmJsRetType::Double, AsmJsType::MaybeDouble));
        mathFunctions[AsmJSMathBuiltin_atan2] = MathFunc(PropertyIds::atan2, Anew(&mAllocator, AsmJsMathFunction, nullptr, &mAllocator, 2, AsmJSMathBuiltin_atan2, OpCodeAsmJs::Atan2_Db, AsmJsRetType::Double, AsmJsType::MaybeDouble, AsmJsType::MaybeDouble));
        mathFunctions[AsmJSMathBuiltin_imul] = MathFunc(PropertyIds::imul, Anew(&mAllocator, AsmJsMathFunction, nullptr, &mAllocator, 2, AsmJSMathBuiltin_imul, OpCodeAsmJs::Imul_Int, AsmJsRetType::Signed, AsmJsType::Intish, AsmJsType::Intish));
        mathFunctions[AsmJSMathBuiltin_fround] = MathFunc(PropertyIds::fround, Anew(&mAllocator, AsmJsMathFunction, nullptr, &mAllocator, 1, AsmJSMathBuiltin_fround, OpCodeAsmJs::Fround_Flt, AsmJsRetType::Float, AsmJsType::Floatish));
        mathFunctions[AsmJSMathBuiltin_min] = MathFunc(PropertyIds::min, Anew(&mAllocator, AsmJsMathFunction, nullptr, &mAllocator, 2, AsmJSMathBuiltin_min, OpCodeAsmJs::Min_Db, AsmJsRetType::Double, AsmJsType::MaybeDouble, AsmJsType::MaybeDouble));
        mathFunctions[AsmJSMathBuiltin_max] = MathFunc(PropertyIds::max, Anew(&mAllocator, AsmJsMathFunction, nullptr, &mAllocator, 2, AsmJSMathBuiltin_max, OpCodeAsmJs::Max_Db, AsmJsRetType::Double, AsmJsType::MaybeDouble, AsmJsType::MaybeDouble));
        mathFunctions[AsmJSMathBuiltin_clz32] = MathFunc(PropertyIds::clz32, Anew(&mAllocator, AsmJsMathFunction, nullptr, &mAllocator, 1, AsmJSMathBuiltin_clz32, OpCodeAsmJs::Clz32_Int, AsmJsRetType::Fixnum, AsmJsType::Intish));

        mathFunctions[AsmJSMathBuiltin_abs].val->SetOverload(Anew(&mAllocator, AsmJsMathFunction, nullptr, &mAllocator, 1, AsmJSMathBuiltin_abs, OpCodeAsmJs::Abs_Int, AsmJsRetType::Unsigned, AsmJsType::Signed));
        mathFunctions[AsmJSMathBuiltin_min].val->SetOverload(Anew(&mAllocator, AsmJsMathFunction, nullptr, &mAllocator, 2, AsmJSMathBuiltin_min, OpCodeAsmJs::Min_Int, AsmJsRetType::Signed, AsmJsType::Signed, AsmJsType::Signed));
        mathFunctions[AsmJSMathBuiltin_max].val->SetOverload(Anew(&mAllocator, AsmJsMathFunction, nullptr, &mAllocator, 2, AsmJSMathBuiltin_max, OpCodeAsmJs::Max_Int, AsmJsRetType::Signed, AsmJsType::Signed, AsmJsType::Signed));

        //Float Overloads
        mathFunctions[AsmJSMathBuiltin_fround].val->SetOverload(Anew(&mAllocator, AsmJsMathFunction, nullptr, &mAllocator, 1, AsmJSMathBuiltin_fround, OpCodeAsmJs::Fround_Db, AsmJsRetType::Float, AsmJsType::MaybeDouble));
        mathFunctions[AsmJSMathBuiltin_fround].val->SetOverload(Anew(&mAllocator, AsmJsMathFunction, nullptr, &mAllocator, 1, AsmJSMathBuiltin_fround, OpCodeAsmJs::Fround_Int, AsmJsRetType::Float, AsmJsType::Int));// should we split this into signed and unsigned?
        mathFunctions[AsmJSMathBuiltin_abs].val->SetOverload(Anew(&mAllocator, AsmJsMathFunction, nullptr, &mAllocator, 1, AsmJSMathBuiltin_abs, OpCodeAsmJs::Abs_Flt, AsmJsRetType::Floatish, AsmJsType::MaybeFloat));
        mathFunctions[AsmJSMathBuiltin_ceil].val->SetOverload(Anew(&mAllocator, AsmJsMathFunction, nullptr, &mAllocator, 1, AsmJSMathBuiltin_ceil, OpCodeAsmJs::Ceil_Flt, AsmJsRetType::Floatish, AsmJsType::MaybeFloat));
        mathFunctions[AsmJSMathBuiltin_floor].val->SetOverload(Anew(&mAllocator, AsmJsMathFunction, nullptr, &mAllocator, 1, AsmJSMathBuiltin_floor, OpCodeAsmJs::Floor_Flt, AsmJsRetType::Floatish, AsmJsType::MaybeFloat));
        mathFunctions[AsmJSMathBuiltin_sqrt].val->SetOverload(Anew(&mAllocator, AsmJsMathFunction, nullptr, &mAllocator, 1, AsmJSMathBuiltin_sqrt, OpCodeAsmJs::Sqrt_Flt, AsmJsRetType::Floatish, AsmJsType::MaybeFloat));

        for (int i = 0; i < AsmJSMathBuiltinFunction_COUNT; i++)
        {
            if (!AddStandardLibraryMathName((PropertyId)mathFunctions[i].id, mathFunctions[i].val, mathFunctions[i].val->GetMathBuiltInFunction()))
            {
                return false;
            }
        }

        struct ConstMath
        {
            ConstMath(PropertyId id_, const double* val_, AsmJSMathBuiltinFunction mathLibConstName_) :
                id(id_), val(val_), mathLibConstName(mathLibConstName_) { }
            PropertyId id;
            AsmJSMathBuiltinFunction mathLibConstName;
            const double* val;
        };
        ConstMath constMath[] = {
            ConstMath(PropertyIds::E       , &Math::E                           , AsmJSMathBuiltinFunction::AsmJSMathBuiltin_e),
            ConstMath(PropertyIds::LN10     , &Math::LN10                        , AsmJSMathBuiltinFunction::AsmJSMathBuiltin_ln10),
            ConstMath(PropertyIds::LN2      , &Math::LN2                         , AsmJSMathBuiltinFunction::AsmJSMathBuiltin_ln2),
            ConstMath(PropertyIds::LOG2E    , &Math::LOG2E                       , AsmJSMathBuiltinFunction::AsmJSMathBuiltin_log2e),
            ConstMath(PropertyIds::LOG10E   , &Math::LOG10E                      , AsmJSMathBuiltinFunction::AsmJSMathBuiltin_log10e),
            ConstMath(PropertyIds::PI       , &Math::PI                          , AsmJSMathBuiltinFunction::AsmJSMathBuiltin_pi),
            ConstMath(PropertyIds::SQRT1_2  , &Math::SQRT1_2                     , AsmJSMathBuiltinFunction::AsmJSMathBuiltin_sqrt1_2),
            ConstMath(PropertyIds::SQRT2    , &Math::SQRT2                       , AsmJSMathBuiltinFunction::AsmJSMathBuiltin_sqrt2),
            ConstMath(PropertyIds::Infinity , &NumberConstants::POSITIVE_INFINITY, AsmJSMathBuiltinFunction::AsmJSMathBuiltin_infinity),
            ConstMath(PropertyIds::NaN      , &NumberConstants::NaN              , AsmJSMathBuiltinFunction::AsmJSMathBuiltin_nan),
        };
        const int size = sizeof(constMath) / sizeof(ConstMath);
        for (int i = 0; i < size; i++)
        {
            if (!AddStandardLibraryMathName(constMath[i].id, constMath[i].val, constMath[i].mathLibConstName))
            {
                return false;
            }
        }


        struct ArrayFunc
        {
            ArrayFunc(PropertyId id_ = 0, AsmJsTypedArrayFunction* val_ = nullptr) :
                id(id_), val(val_)
            {
            }
            PropertyId id;
            AsmJsTypedArrayFunction* val;
        };

        ArrayFunc arrayFunctions[AsmJSMathBuiltinFunction_COUNT];
        arrayFunctions[AsmJSTypedArrayBuiltin_Int8Array] = ArrayFunc(PropertyIds::Int8Array, Anew(&mAllocator, AsmJsTypedArrayFunction, nullptr, &mAllocator, AsmJSTypedArrayBuiltin_Int8Array, ArrayBufferView::TYPE_INT8));
        arrayFunctions[AsmJSTypedArrayBuiltin_Uint8Array] = ArrayFunc(PropertyIds::Uint8Array, Anew(&mAllocator, AsmJsTypedArrayFunction, nullptr, &mAllocator, AsmJSTypedArrayBuiltin_Uint8Array, ArrayBufferView::TYPE_UINT8));
        arrayFunctions[AsmJSTypedArrayBuiltin_Int16Array] = ArrayFunc(PropertyIds::Int16Array, Anew(&mAllocator, AsmJsTypedArrayFunction, nullptr, &mAllocator, AsmJSTypedArrayBuiltin_Int16Array, ArrayBufferView::TYPE_INT16));
        arrayFunctions[AsmJSTypedArrayBuiltin_Uint16Array] = ArrayFunc(PropertyIds::Uint16Array, Anew(&mAllocator, AsmJsTypedArrayFunction, nullptr, &mAllocator, AsmJSTypedArrayBuiltin_Uint16Array, ArrayBufferView::TYPE_UINT16));
        arrayFunctions[AsmJSTypedArrayBuiltin_Int32Array] = ArrayFunc(PropertyIds::Int32Array, Anew(&mAllocator, AsmJsTypedArrayFunction, nullptr, &mAllocator, AsmJSTypedArrayBuiltin_Int32Array, ArrayBufferView::TYPE_INT32));
        arrayFunctions[AsmJSTypedArrayBuiltin_Uint32Array] = ArrayFunc(PropertyIds::Uint32Array, Anew(&mAllocator, AsmJsTypedArrayFunction, nullptr, &mAllocator, AsmJSTypedArrayBuiltin_Uint32Array, ArrayBufferView::TYPE_UINT32));
        arrayFunctions[AsmJSTypedArrayBuiltin_Float32Array] = ArrayFunc(PropertyIds::Float32Array, Anew(&mAllocator, AsmJsTypedArrayFunction, nullptr, &mAllocator, AsmJSTypedArrayBuiltin_Float32Array, ArrayBufferView::TYPE_FLOAT32));
        arrayFunctions[AsmJSTypedArrayBuiltin_Float64Array] = ArrayFunc(PropertyIds::Float64Array, Anew(&mAllocator, AsmJsTypedArrayFunction, nullptr, &mAllocator, AsmJSTypedArrayBuiltin_Float64Array, ArrayBufferView::TYPE_FLOAT64));

        for (int i = 0; i < AsmJSTypedArrayBuiltin_COUNT; i++)
        {
            if (!AddStandardLibraryArrayName((PropertyId)arrayFunctions[i].id, arrayFunctions[i].val, arrayFunctions[i].val->GetArrayBuiltInFunction()))
            {
                return false;
            }
        }
        return true;
    }